

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ErrorCheckNewFrameSanityChecks(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImFont **ppIVar3;
  int n;
  ImGuiContext *g;
  int in_stack_ffffffffffffffec;
  char cVar4;
  char cVar5;
  char cVar6;
  undefined4 in_stack_fffffffffffffff4;
  int iVar7;
  
  pIVar1 = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b8d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((0.0 < (GImGui->IO).DeltaTime) || (cVar6 = '\0', GImGui->FrameCount == 0)) {
    cVar6 = '\x01';
  }
  if (cVar6 == '\0') {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b8e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->FrameCount == 0) || (cVar5 = '\0', GImGui->FrameCountEnded == GImGui->FrameCount)) {
    cVar5 = '\x01';
  }
  if (cVar5 == '\0') {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b8f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  cVar4 = '\0';
  if ((0.0 <= (GImGui->IO).DisplaySize.x) && (cVar4 = '\0', 0.0 <= (GImGui->IO).DisplaySize.y)) {
    cVar4 = '\x01';
  }
  if (cVar4 == '\0') {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b90,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  bVar2 = 0 < (((GImGui->IO).Fonts)->Fonts).Size;
  if (!bVar2) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b91,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  ppIVar3 = ImVector<ImFont_*>::operator[]
                      ((ImVector<ImFont_*> *)
                       CONCAT44(in_stack_fffffffffffffff4,
                                CONCAT13(cVar6,CONCAT12(cVar5,CONCAT11(cVar4,bVar2)))),
                       in_stack_ffffffffffffffec);
  bVar2 = ImFont::IsLoaded(*ppIVar3);
  if (!bVar2) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b92,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((pIVar1->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b93,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (0.0 < (pIVar1->Style).CircleTessellationMaxError) {
    bVar2 = false;
    if ((0.0 <= (pIVar1->Style).Alpha) && (bVar2 = false, (pIVar1->Style).Alpha <= 1.0)) {
      bVar2 = true;
    }
    if (!bVar2) {
      __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1b95,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    bVar2 = false;
    if ((1.0 <= (pIVar1->Style).WindowMinSize.x) &&
       (bVar2 = false, 1.0 <= (pIVar1->Style).WindowMinSize.y)) {
      bVar2 = true;
    }
    if (!bVar2) {
      __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1b96,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    bVar2 = true;
    if (((pIVar1->Style).WindowMenuButtonPosition != -1) &&
       (bVar2 = true, (pIVar1->Style).WindowMenuButtonPosition != 0)) {
      bVar2 = (pIVar1->Style).WindowMenuButtonPosition == 1;
    }
    if (!bVar2) {
      __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1b97,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    iVar7 = 0;
    while( true ) {
      if (0x15 < iVar7) {
        if ((((pIVar1->IO).ConfigFlags & 1U) != 0) && ((pIVar1->IO).KeyMap[0xc] == -1)) {
          __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                        ,0x1b9d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((((pIVar1->IO).ConfigWindowsResizeFromEdges & 1U) != 0) &&
           (((pIVar1->IO).BackendFlags & 2U) == 0)) {
          (pIVar1->IO).ConfigWindowsResizeFromEdges = false;
        }
        return;
      }
      bVar2 = false;
      if ((-2 < (pIVar1->IO).KeyMap[iVar7]) && (bVar2 = false, (pIVar1->IO).KeyMap[iVar7] < 0x200))
      {
        bVar2 = true;
      }
      if (!bVar2) break;
      iVar7 = iVar7 + 1;
    }
    __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1b99,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x1b94,"void ImGui::ErrorCheckNewFrameSanityChecks()");
}

Assistant:

static void ImGui::ErrorCheckNewFrameSanityChecks()
{
    ImGuiContext& g = *GImGui;

    // Check user IM_ASSERT macro
    // (IF YOU GET A WARNING OR COMPILE ERROR HERE: it means you assert macro is incorrectly defined!
    //  If your macro uses multiple statements, it NEEDS to be surrounded by a 'do { ... } while (0)' block.
    //  This is a common C/C++ idiom to allow multiple statements macros to be used in control flow blocks.)
    // #define IM_ASSERT(EXPR)   if (SomeCode(EXPR)) SomeMoreCode();                    // Wrong!
    // #define IM_ASSERT(EXPR)   do { if (SomeCode(EXPR)) SomeMoreCode(); } while (0)   // Correct!
    if (true) IM_ASSERT(1); else IM_ASSERT(0);

    // Check user data
    // (We pass an error message in the assert expression to make it visible to programmers who are not using a debugger, as most assert handlers display their argument)
    IM_ASSERT(g.Initialized);
    IM_ASSERT((g.IO.DeltaTime > 0.0f || g.FrameCount == 0)              && "Need a positive DeltaTime!");
    IM_ASSERT((g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount)  && "Forgot to call Render() or EndFrame() at the end of the previous frame?");
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f  && "Invalid DisplaySize value!");
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0                                && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?");
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded()                          && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?");
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f                       && "Invalid style setting!");
    IM_ASSERT(g.Style.CircleTessellationMaxError  > 0.0f                && "Invalid style setting!");
    IM_ASSERT(g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f            && "Invalid style setting!"); // Allows us to avoid a few clamps in color computations
    IM_ASSERT(g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && "Invalid style setting.");
    IM_ASSERT(g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right);
    for (int n = 0; n < ImGuiKey_COUNT; n++)
        IM_ASSERT(g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && "io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)");

    // Check: required key mapping (we intentionally do NOT check all keys to not pressure user into setting up everything, but Space is required and was only added in 1.60 WIP)
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)
        IM_ASSERT(g.IO.KeyMap[ImGuiKey_Space] != -1 && "ImGuiKey_Space is not mapped, required for keyboard navigation.");

    // Check: the io.ConfigWindowsResizeFromEdges option requires backend to honor mouse cursor changes and set the ImGuiBackendFlags_HasMouseCursors flag accordingly.
    if (g.IO.ConfigWindowsResizeFromEdges && !(g.IO.BackendFlags & ImGuiBackendFlags_HasMouseCursors))
        g.IO.ConfigWindowsResizeFromEdges = false;
}